

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLScanner::recreateUIntPool(XMLScanner *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint i;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUIntPool[uVar3]);
    uVar2 = (int)uVar3 + 1;
    uVar3 = (ulong)uVar2;
  } while (uVar2 <= this->fUIntPoolRow);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUIntPool);
  this->fUIntPoolRow = 0;
  this->fUIntPoolCol = 0;
  this->fUIntPoolRowTotal = 2;
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,0x10);
  this->fUIntPool = (uint **)CONCAT44(extraout_var,iVar1);
  iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])();
  *this->fUIntPool = (uint *)CONCAT44(extraout_var_00,iVar1);
  memset(this->fUIntPool[this->fUIntPoolRow],0,0x100);
  this->fUIntPool[1] = (uint *)0x0;
  return;
}

Assistant:

void XMLScanner::recreateUIntPool()
{
    // this allows a bloated unsigned int pool to be dispensed with

    // first, delete old fUIntPool
    for (unsigned int i=0; i<=fUIntPoolRow; i++)
    {
        fMemoryManager->deallocate(fUIntPool[i]);
    }
    fMemoryManager->deallocate(fUIntPool);

    fUIntPoolRow = fUIntPoolCol = 0;
    fUIntPoolRowTotal = 2;
    fUIntPool = (unsigned int **)fMemoryManager->allocate(sizeof(unsigned int *) * fUIntPoolRowTotal);
    fUIntPool[0] = (unsigned int *)fMemoryManager->allocate(sizeof(unsigned int) << 6);
    memset(fUIntPool[fUIntPoolRow], 0, sizeof(unsigned int) << 6);
    fUIntPool[1] = 0;
}